

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpOps.cpp
# Opt level: O3

sz_sock sznet::net::sockets::sz_udp_create(int family)

{
  int iVar1;
  SourceFile file;
  Logger local_fe0;
  
  iVar1 = socket(family,2,0x11);
  if (iVar1 < 0) {
    file._8_8_ = 10;
    file.m_data = "UdpOps.cpp";
    Logger::Logger(&local_fe0,file,0x13,true);
    if (0x16 < (uint)(((int)&local_fe0 + 0xfb0) - (int)local_fe0.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe0.m_impl.m_stream.m_buffer.m_cur,"sockets::sz_udp_create",0x16);
      local_fe0.m_impl.m_stream.m_buffer.m_cur = local_fe0.m_impl.m_stream.m_buffer.m_cur + 0x16;
    }
    Logger::~Logger(&local_fe0);
  }
  return iVar1;
}

Assistant:

sz_sock sz_udp_create(int family)
{
	sz_sock sockfd = ::socket(family, SOCK_DGRAM, IPPROTO_UDP);
	if (sockfd < 0)
	{
		LOG_SYSFATAL << "sockets::sz_udp_create";
	}

	return sockfd;
}